

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gleam.cxx
# Opt level: O1

Fl_Boxtype fl_define_FL_GLEAM_UP_BOX(void)

{
  fl_internal_boxtype(_FL_GLEAM_UP_BOX,up_box);
  fl_internal_boxtype(_FL_GLEAM_DOWN_BOX,down_box);
  fl_internal_boxtype(_FL_GLEAM_UP_FRAME,up_frame);
  fl_internal_boxtype(_FL_GLEAM_DOWN_FRAME,down_frame);
  fl_internal_boxtype(_FL_GLEAM_THIN_UP_BOX,thin_up_box);
  fl_internal_boxtype(_FL_GLEAM_THIN_DOWN_BOX,thin_down_box);
  fl_internal_boxtype(_FL_GLEAM_ROUND_UP_BOX,up_box);
  fl_internal_boxtype(_FL_GLEAM_ROUND_DOWN_BOX,down_box);
  return _FL_GLEAM_UP_BOX;
}

Assistant:

Fl_Boxtype fl_define_FL_GLEAM_UP_BOX() {
  fl_internal_boxtype(_FL_GLEAM_UP_BOX, up_box);
  fl_internal_boxtype(_FL_GLEAM_DOWN_BOX, down_box);
  fl_internal_boxtype(_FL_GLEAM_UP_FRAME, up_frame);
  fl_internal_boxtype(_FL_GLEAM_DOWN_FRAME, down_frame);
  fl_internal_boxtype(_FL_GLEAM_THIN_UP_BOX, thin_up_box);
  fl_internal_boxtype(_FL_GLEAM_THIN_DOWN_BOX, thin_down_box);
  fl_internal_boxtype(_FL_GLEAM_ROUND_UP_BOX, up_box);
  fl_internal_boxtype(_FL_GLEAM_ROUND_DOWN_BOX, down_box);
  return _FL_GLEAM_UP_BOX;
}